

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

RenderBox * __thiscall
Rml::Element::GetRenderBox
          (RenderBox *__return_storage_ptr__,Element *this,BoxArea fill_area,int index)

{
  pointer pPVar1;
  code *pcVar2;
  Vector2<float> VVar3;
  Vector2f VVar4;
  Vector2f VVar5;
  bool bVar6;
  int area;
  BoxArea area_00;
  pointer this_00;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  CornerSizes CVar11;
  Vector2f local_88;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  
  if ((2 < fill_area - Border) &&
     (bVar6 = Assert("Render box can only be generated with fill area of border, padding or content."
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x1f7), !bVar6)) {
LAB_00280739:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  if ((index < 1) ||
     (pPVar1 = (this->additional_boxes).
               super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->additional_boxes).
                         super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) >> 6) < index))
  {
    this_00 = (pointer)&this->main_box;
    local_88 = this->rounded_main_padding_size;
    fVar7 = 0.0;
    fVar10 = 0.0;
  }
  else {
    this_00 = pPVar1 + ((ulong)(uint)index - 1);
    local_88 = Box::GetSize(&this_00->box,Padding);
    VVar3 = Vector2<float>::Round(&pPVar1[(ulong)(uint)index - 1].offset);
    fVar7 = VVar3.x;
    fVar10 = VVar3.y;
  }
  local_68 = 0.0;
  fStack_64 = 0.0;
  local_78 = 0.0;
  fStack_74 = 0.0;
  for (area_00 = Border; (int)area_00 < (int)fill_area; area_00 = area_00 + Border) {
    fVar8 = Box::GetEdge(&this_00->box,area_00,Top);
    fVar9 = Box::GetEdge(&this_00->box,area_00,Right);
    local_78 = local_78 + fVar8;
    fStack_74 = fStack_74 + fVar9;
    fVar8 = Box::GetEdge(&this_00->box,area_00,Bottom);
    fVar9 = Box::GetEdge(&this_00->box,area_00,Left);
    local_68 = local_68 + fVar8;
    fStack_64 = fStack_64 + fVar9;
  }
  fVar8 = 0.0;
  fVar9 = 0.0;
  switch(fill_area) {
  case Margin:
  case Auto:
    bVar6 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                   ,0x219);
    fVar8 = 0.0;
    fVar9 = 0.0;
    if (!bVar6) goto LAB_00280739;
    break;
  case Border:
    VVar4 = Box::GetFrameSize(&this_00->box,Border);
    fVar8 = local_88.x + VVar4.x;
    fVar9 = local_88.y + VVar4.y;
    break;
  case Padding:
    fVar8 = local_88.x;
    fVar9 = local_88.y;
    break;
  case Content:
    VVar4 = Box::GetFrameSize(&this_00->box,Padding);
    fVar8 = local_88.x - VVar4.x;
    fVar9 = local_88.y - VVar4.y;
  }
  CVar11 = Style::ComputedValues::border_radius(&this->meta->computed_values);
  VVar4.y = fVar9;
  VVar4.x = fVar8;
  VVar5.y = fVar10;
  VVar5.x = fVar7;
  __return_storage_ptr__->fill_size = VVar4;
  __return_storage_ptr__->border_offset = VVar5;
  (__return_storage_ptr__->border_widths)._M_elems[0] = local_78;
  (__return_storage_ptr__->border_widths)._M_elems[1] = fStack_74;
  (__return_storage_ptr__->border_widths)._M_elems[2] = local_68;
  (__return_storage_ptr__->border_widths)._M_elems[3] = fStack_64;
  *&(__return_storage_ptr__->border_radius)._M_elems = CVar11._M_elems;
  return __return_storage_ptr__;
}

Assistant:

RenderBox Element::GetRenderBox(BoxArea fill_area, int index)
{
	RMLUI_ASSERTMSG(fill_area >= BoxArea::Border && fill_area <= BoxArea::Content,
		"Render box can only be generated with fill area of border, padding or content.");

	UpdateAbsoluteOffsetAndRenderBoxData();

	struct BoxReference {
		const Box& box;
		Vector2f padding_size;
		Vector2f offset;
	};
	auto GetBoxAndOffset = [this, index]() {
		const int additional_box_index = index - 1;
		if (index < 1 || additional_box_index >= (int)additional_boxes.size())
			return BoxReference{main_box, rounded_main_padding_size, {}};
		const PositionedBox& positioned_box = additional_boxes[additional_box_index];
		return BoxReference{positioned_box.box, positioned_box.box.GetSize(BoxArea::Padding), positioned_box.offset.Round()};
	};

	BoxReference box = GetBoxAndOffset();

	EdgeSizes edge_sizes = {};
	for (int area = (int)BoxArea::Border; area < (int)fill_area; area++)
	{
		edge_sizes[0] += box.box.GetEdge(BoxArea(area), BoxEdge::Top);
		edge_sizes[1] += box.box.GetEdge(BoxArea(area), BoxEdge::Right);
		edge_sizes[2] += box.box.GetEdge(BoxArea(area), BoxEdge::Bottom);
		edge_sizes[3] += box.box.GetEdge(BoxArea(area), BoxEdge::Left);
	}
	Vector2f inner_size;
	switch (fill_area)
	{
	case BoxArea::Border: inner_size = box.padding_size + box.box.GetFrameSize(BoxArea::Border); break;
	case BoxArea::Padding: inner_size = box.padding_size; break;
	case BoxArea::Content: inner_size = box.padding_size - box.box.GetFrameSize(BoxArea::Padding); break;
	case BoxArea::Margin:
	case BoxArea::Auto: RMLUI_ERROR;
	}

	return RenderBox{inner_size, box.offset, edge_sizes, meta->computed_values.border_radius()};
}